

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fid_cgap.h
# Opt level: O2

ulint __thiscall bwtil::fid_cgap::serialize(fid_cgap *this,ostream *out)

{
  ulong uVar1;
  pointer pbVar2;
  fid_cgap *pfVar3;
  ulint uVar4;
  long lVar5;
  ulint i;
  ulong __n;
  pointer pbVar6;
  reference rVar7;
  ulint v_sel_size;
  fid_cgap *local_100;
  ulint bsds_size;
  bool b;
  
  uVar4 = 8;
  ::std::ostream::write((char *)out,(long)this);
  if (this->W != 0) {
    ::std::ostream::write((char *)out,(long)&this->u);
    ::std::ostream::write((char *)out,(long)&this->n);
    ::std::ostream::write((char *)out,(long)&this->v);
    ::std::ostream::write((char *)out,(long)&this->t);
    ::std::ostream::write((char *)out,(long)&this->number_of_v_blocks);
    ::std::ostream::write((char *)out,(long)&this->number_of_t_blocks);
    v_sel_size = (long)(this->V_select).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->V_select).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
    ::std::ostream::write((char *)out,(long)&v_sel_size);
    bsds_size = ((long)(this->BSDs).
                       super__Vector_base<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                (long)(this->BSDs).
                      super__Vector_base<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0xc0;
    ::std::ostream::write((char *)out,(long)&bsds_size);
    cgap_dictionary::serialize(&this->D,out);
    local_100 = this;
    for (__n = 0; pfVar3 = local_100, uVar1 = this->number_of_v_blocks, __n < uVar1; __n = __n + 1)
    {
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->V,__n);
      b = (*rVar7._M_p & rVar7._M_mask) != 0;
      ::std::ostream::write((char *)out,(long)&b);
    }
    ::std::ostream::write
              ((char *)out,
               (long)(local_100->V_rank).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start);
    uVar4 = pfVar3->number_of_v_blocks;
    ::std::ostream::write
              ((char *)out,
               (long)(pfVar3->V_select).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start);
    lVar5 = uVar4 + v_sel_size;
    ::std::ostream::write
              ((char *)out,
               (long)(pfVar3->R).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    uVar4 = pfVar3->number_of_v_blocks;
    ::std::ostream::write
              ((char *)out,
               (long)(pfVar3->R_1).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    lVar5 = uVar1 + 0x40 + (lVar5 + uVar4 + v_sel_size) * 8;
    pbVar2 = (pfVar3->BSDs).super__Vector_base<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pbVar6 = (pfVar3->BSDs).
                  super__Vector_base<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>._M_impl.
                  super__Vector_impl_data._M_start; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1) {
      bsd_cgap::bsd_cgap((bsd_cgap *)&b,pbVar6);
      uVar4 = bsd_cgap::serialize((bsd_cgap *)&b,out);
      lVar5 = lVar5 + uVar4;
      bsd_cgap::~bsd_cgap((bsd_cgap *)&b);
    }
    ::std::ostream::write
              ((char *)out,
               (long)(pfVar3->SEL).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    uVar4 = lVar5 + pfVar3->number_of_t_blocks * 8;
  }
  return uVar4;
}

Assistant:

ulint serialize(std::ostream& out){

		out.write((char *)&W, sizeof(ulint));

		if(W==0) return sizeof(ulint);

		out.write((char *)&u, sizeof(ulint));
		out.write((char *)&n, sizeof(ulint));
		out.write((char *)&v, sizeof(ulint));
		out.write((char *)&t, sizeof(ulint));
		out.write((char *)&number_of_v_blocks, sizeof(ulint));
		out.write((char *)&number_of_t_blocks, sizeof(ulint));

		ulint v_sel_size = V_select.size();
		out.write((char *)&v_sel_size, sizeof(ulint));

		ulint bsds_size = BSDs.size();
		out.write((char *)&bsds_size, sizeof(ulint));

		ulint w_bytes = 8*sizeof(ulint);

		D.serialize(out);

		for(ulint i=0;i<number_of_v_blocks;++i){
			bool b = V[i];
			out.write((char *)&b, sizeof(bool));
		}

		w_bytes += number_of_v_blocks*sizeof(bool);

		out.write((char *)V_rank.data(), number_of_v_blocks*sizeof(ulint));
		w_bytes += number_of_v_blocks*sizeof(ulint);

		out.write((char *)V_select.data(), v_sel_size*sizeof(ulint));
		w_bytes += v_sel_size*sizeof(ulint);

		out.write((char *)R.data(), number_of_v_blocks*sizeof(ulint));
		w_bytes += number_of_v_blocks*sizeof(ulint);

		out.write((char *)R_1.data(), v_sel_size*sizeof(ulint));
		w_bytes += v_sel_size*sizeof(ulint);

		for(auto bsd : BSDs)
			w_bytes += bsd.serialize(out);

		out.write((char *)SEL.data(), number_of_t_blocks*sizeof(ulint));
		w_bytes += number_of_t_blocks*sizeof(ulint);

		return w_bytes;

	}